

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase451::run(TestCase451 *this)

{
  char *pcVar1;
  SegmentBuilder *pSVar2;
  word *params_1;
  word *params_2;
  SegmentBuilder *pSVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  Reader value;
  Reader value_00;
  initializer_list<int> value_01;
  initializer_list<int> value_02;
  initializer_list<int> value_03;
  initializer_list<capnp::Text::Reader> value_04;
  initializer_list<capnp::Text::Reader> value_05;
  initializer_list<capnp::Text::Reader> value_06;
  StructBuilder local_2b0;
  Builder sl;
  ListBuilder local_260;
  MallocMessageBuilder defaultBuilder;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestListDefaults>
            (&root,&builder.super_MessageBuilder);
  capnproto_test::capnp::test::TestListDefaults::Builder::initLists(&sl,&root);
  capnproto_test::capnp::test::TestLists::Builder::getList0((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getList0((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1cc,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList0 ().size())\", 0u, sl.getList0 ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList0 ().size())",(uint *)&local_2b0
               ,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getList1((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getList1((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1cd,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList1 ().size())\", 0u, sl.getList1 ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList1 ().size())",(uint *)&local_2b0
               ,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getList8((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getList8((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1ce,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList8 ().size())\", 0u, sl.getList8 ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList8 ().size())",(uint *)&local_2b0
               ,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getList16((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getList16((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1cf,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList16().size())\", 0u, sl.getList16().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList16().size())",(uint *)&local_2b0
               ,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getList32((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getList32((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList32().size())\", 0u, sl.getList32().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList32().size())",(uint *)&local_2b0
               ,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getList64((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getList64((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d1,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getList64().size())\", 0u, sl.getList64().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getList64().size())",(uint *)&local_2b0
               ,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getListP((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getListP((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[49],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d2,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getListP ().size())\", 0u, sl.getListP ().size()"
               ,(char (*) [49])"failed: expected (0u) == (sl.getListP ().size())",(uint *)&local_2b0
               ,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getInt32ListList((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getInt32ListList
              ((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d3,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getInt32ListList().size())\", 0u, sl.getInt32ListList().size()"
               ,(char (*) [56])"failed: expected (0u) == (sl.getInt32ListList().size())",
               (uint *)&local_2b0,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getTextListList((Builder *)&defaultBuilder,&sl);
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getTextListList((Builder *)&defaultBuilder,&sl)
    ;
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d4,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getTextListList().size())\", 0u, sl.getTextListList().size()"
               ,(char (*) [55])"failed: expected (0u) == (sl.getTextListList().size())",
               (uint *)&local_2b0,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::getStructListList((Builder *)&defaultBuilder,&sl)
  ;
  if (((int)defaultBuilder.super_MessageBuilder.arenaSpace[2] != 0) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = (SegmentBuilder *)((ulong)local_2b0.segment & 0xffffffff00000000);
    capnproto_test::capnp::test::TestLists::Builder::getStructListList
              ((Builder *)&defaultBuilder,&sl);
    local_260.segment =
         (SegmentBuilder *)
         CONCAT44(local_260.segment._4_4_,(int)defaultBuilder.super_MessageBuilder.arenaSpace[2]);
    kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x1d5,ERROR,
               "\"failed: expected \" \"(0u) == (sl.getStructListList().size())\", 0u, sl.getStructListList().size()"
               ,(char (*) [57])"failed: expected (0u) == (sl.getStructListList().size())",
               (uint *)&local_2b0,(uint *)&local_260);
  }
  capnproto_test::capnp::test::TestLists::Builder::initList0((Builder *)&defaultBuilder,&sl,2);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,0);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,1);
  capnproto_test::capnp::test::TestLists::Builder::initList1((Builder *)&defaultBuilder,&sl,4);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,0);
  *(byte *)local_2b0.data = *local_2b0.data | 1;
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,1);
  *(byte *)local_2b0.data = *local_2b0.data & 0xfe;
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,2);
  *(byte *)local_2b0.data = *local_2b0.data | 1;
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,3);
  *(byte *)local_2b0.data = *local_2b0.data | 1;
  capnproto_test::capnp::test::TestLists::Builder::initList8((Builder *)&defaultBuilder,&sl,2);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,0);
  *(byte *)local_2b0.data = 0x7b;
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,1);
  *(byte *)local_2b0.data = 0x2d;
  capnproto_test::capnp::test::TestLists::Builder::initList16((Builder *)&defaultBuilder,&sl,2);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,0);
  *(undefined2 *)local_2b0.data = 0x3039;
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,1);
  *(undefined2 *)local_2b0.data = 0x1a85;
  capnproto_test::capnp::test::TestLists::Builder::initList32((Builder *)&defaultBuilder,&sl,2);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,0);
  *(undefined4 *)local_2b0.data = 0x75bcd15;
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,1);
  *(undefined4 *)local_2b0.data = 0xdfb38d2;
  capnproto_test::capnp::test::TestLists::Builder::initList64((Builder *)&defaultBuilder,&sl,2);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,0);
  *(undefined8 *)local_2b0.data = 0x462d53c8abac0;
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,1);
  *(undefined8 *)local_2b0.data = 0x85561edaa4b87;
  capnproto_test::capnp::test::TestLists::Builder::initListP((Builder *)&defaultBuilder,&sl,2);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,0);
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&local_2b0,value);
  ListBuilder::getStructElement(&local_2b0,(ListBuilder *)&defaultBuilder,1);
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "bar";
  capnproto_test::capnp::test::TestLists::StructP::Builder::setF((Builder *)&local_2b0,value_00);
  capnproto_test::capnp::test::TestLists::Builder::initInt32ListList
            ((Builder *)&defaultBuilder,&sl,3);
  local_2b0.segment = (SegmentBuilder *)0x200000001;
  local_2b0.capTable = (CapTableBuilder *)CONCAT44(local_2b0.capTable._4_4_,3);
  value_01._M_len = 3;
  value_01._M_array = (iterator)&local_2b0;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&defaultBuilder,0,value_01);
  local_2b0.segment = (SegmentBuilder *)0x500000004;
  value_02._M_len = 2;
  value_02._M_array = (iterator)&local_2b0;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&defaultBuilder,1,value_02);
  local_2b0.segment = (SegmentBuilder *)CONCAT44(local_2b0.segment._4_4_,0xbc4ff2);
  value_03._M_len = 1;
  value_03._M_array = (iterator)&local_2b0;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&defaultBuilder,2,value_03);
  capnproto_test::capnp::test::TestLists::Builder::initTextListList
            ((Builder *)&defaultBuilder,&sl,3);
  local_2b0.segment = (SegmentBuilder *)0x2c4141;
  local_2b0.capTable = (CapTableBuilder *)0x4;
  local_2b0.data = "bar";
  local_2b0.pointers = (WirePointer *)0x4;
  value_04._M_len = 2;
  value_04._M_array = (iterator)&local_2b0;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&defaultBuilder,0,value_04);
  local_2b0.segment = (SegmentBuilder *)0x2cc7a6;
  local_2b0.capTable = (CapTableBuilder *)0x4;
  value_05._M_len = 1;
  value_05._M_array = (iterator)&local_2b0;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&defaultBuilder,1,value_05);
  local_2b0.segment = (SegmentBuilder *)0x2d2176;
  local_2b0.capTable = (CapTableBuilder *)0x4;
  local_2b0.data = "corge";
  local_2b0.pointers = (WirePointer *)0x6;
  value_06._M_len = 2;
  value_06._M_array = (iterator)&local_2b0;
  List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
            ((Builder *)&defaultBuilder,2,value_06);
  capnproto_test::capnp::test::TestLists::Builder::initStructListList
            ((Builder *)&defaultBuilder,&sl,2);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init((Builder *)&local_2b0,(EVP_PKEY_CTX *)&defaultBuilder);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::init((Builder *)&local_2b0,(EVP_PKEY_CTX *)&defaultBuilder);
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::operator[]((Builder *)&local_260,(Builder *)&defaultBuilder,0);
  ListBuilder::getStructElement(&local_2b0,&local_260,0);
  pcVar1 = (char *)((long)local_2b0.data + 4);
  pcVar1[0] = '{';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::operator[]((Builder *)&local_260,(Builder *)&defaultBuilder,0);
  ListBuilder::getStructElement(&local_2b0,&local_260,1);
  pcVar1 = (char *)((long)local_2b0.data + 4);
  pcVar1[0] = -0x38;
  pcVar1[1] = '\x01';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>::
  Builder::operator[]((Builder *)&local_260,(Builder *)&defaultBuilder,1);
  ListBuilder::getStructElement(&local_2b0,&local_260,0);
  pcVar1 = (char *)((long)local_2b0.data + 4);
  pcVar1[0] = '\x15';
  pcVar1[1] = '\x03';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  AVar4 = MessageBuilder::getSegmentsForOutput(&builder.super_MessageBuilder);
  params_2 = (AVar4.ptr)->ptr;
  pSVar2 = (SegmentBuilder *)(AVar4.ptr)->size_;
  MallocMessageBuilder::MallocMessageBuilder(&defaultBuilder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestListDefaults>
            ((Builder *)&local_2b0,&defaultBuilder.super_MessageBuilder);
  capnproto_test::capnp::test::TestListDefaults::Builder::getLists
            ((Builder *)&local_260,(Builder *)&local_2b0);
  AVar4 = MessageBuilder::getSegmentsForOutput(&defaultBuilder.super_MessageBuilder);
  params_1 = (AVar4.ptr)->ptr;
  pSVar3 = (SegmentBuilder *)(AVar4.ptr)->size_;
  if ((pSVar3 != pSVar2) && (kj::_::Debug::minSeverity < 3)) {
    local_2b0.segment = pSVar3;
    local_260.segment = pSVar2;
    kj::_::Debug::log<char_const(&)[61],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x200,ERROR,
               "\"failed: expected \" \"(defaultSegment.size()) == (segment.size())\", defaultSegment.size(), segment.size()"
               ,(char (*) [61])"failed: expected (defaultSegment.size()) == (segment.size())",
               (unsigned_long *)&local_2b0,(unsigned_long *)&local_260);
  }
  if (pSVar2 < pSVar3) {
    pSVar3 = pSVar2;
  }
  while (pSVar3 != (SegmentBuilder *)0x0) {
    if ((params_1->content != params_2->content) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[139],unsigned_long_const&,unsigned_long_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x204,ERROR,
                 "\"failed: expected \" \"(reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i]) == (reinterpret_cast<const uint64_t*>(segment.begin())[i])\", reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i], reinterpret_cast<const uint64_t*>(segment.begin())[i]"
                 ,(char (*) [139])
                  "failed: expected (reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i]) == (reinterpret_cast<const uint64_t*>(segment.begin())[i])"
                 ,&params_1->content,&params_2->content);
    }
    params_1 = params_1 + 1;
    params_2 = params_2 + 1;
    pSVar3 = (SegmentBuilder *)&pSVar3[-1].field_0x37;
  }
  MallocMessageBuilder::~MallocMessageBuilder(&defaultBuilder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, SmallStructLists) {
  // In this test, we will manually initialize TestListDefaults.lists to match the default
  // value and verify that we end up with the same encoding that the compiler produces.

  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestListDefaults>();
  auto sl = root.initLists();

  // Verify that all the lists are actually empty.
  EXPECT_EQ(0u, sl.getList0 ().size());
  EXPECT_EQ(0u, sl.getList1 ().size());
  EXPECT_EQ(0u, sl.getList8 ().size());
  EXPECT_EQ(0u, sl.getList16().size());
  EXPECT_EQ(0u, sl.getList32().size());
  EXPECT_EQ(0u, sl.getList64().size());
  EXPECT_EQ(0u, sl.getListP ().size());
  EXPECT_EQ(0u, sl.getInt32ListList().size());
  EXPECT_EQ(0u, sl.getTextListList().size());
  EXPECT_EQ(0u, sl.getStructListList().size());

  { auto l = sl.initList0 (2); l[0].setF(VOID);              l[1].setF(VOID); }
  { auto l = sl.initList1 (4); l[0].setF(true);              l[1].setF(false);
                               l[2].setF(true);              l[3].setF(true); }
  { auto l = sl.initList8 (2); l[0].setF(123u);              l[1].setF(45u); }
  { auto l = sl.initList16(2); l[0].setF(12345u);            l[1].setF(6789u); }
  { auto l = sl.initList32(2); l[0].setF(123456789u);        l[1].setF(234567890u); }
  { auto l = sl.initList64(2); l[0].setF(1234567890123456u); l[1].setF(2345678901234567u); }
  { auto l = sl.initListP (2); l[0].setF("foo");             l[1].setF("bar"); }

  {
    auto l = sl.initInt32ListList(3);
    l.set(0, {1, 2, 3});
    l.set(1, {4, 5});
    l.set(2, {12341234});
  }

  {
    auto l = sl.initTextListList(3);
    l.set(0, {"foo", "bar"});
    l.set(1, {"baz"});
    l.set(2, {"qux", "corge"});
  }

  {
    auto l = sl.initStructListList(2);
    l.init(0, 2);
    l.init(1, 1);

    l[0][0].setInt32Field(123);
    l[0][1].setInt32Field(456);
    l[1][0].setInt32Field(789);
  }

  kj::ArrayPtr<const word> segment = builder.getSegmentsForOutput()[0];

  // Initialize another message such that it copies the default value for that field.
  MallocMessageBuilder defaultBuilder;
  defaultBuilder.getRoot<TestListDefaults>().getLists();
  kj::ArrayPtr<const word> defaultSegment = defaultBuilder.getSegmentsForOutput()[0];

  // Should match...
  EXPECT_EQ(defaultSegment.size(), segment.size());

  for (size_t i = 0; i < kj::min(segment.size(), defaultSegment.size()); i++) {
    EXPECT_EQ(reinterpret_cast<const uint64_t*>(defaultSegment.begin())[i],
              reinterpret_cast<const uint64_t*>(segment.begin())[i]);
  }
}